

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall ON_SubDHeap::ReturnEdgeExtraArray(ON_SubDHeap *this,ON_SubDEdge *e)

{
  if (e == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  else {
    if (e->m_facex != (ON_SubDFacePtr *)0x0 || e->m_facex_capacity != 0) {
      ReturnArray(this,(ulong)e->m_facex_capacity,&e->m_facex->m_ptr);
      e->m_facex = (ON_SubDFacePtr *)0x0;
      e->m_facex_capacity = 0;
    }
    if (2 < e->m_face_count) {
      e->m_face_count = 2;
    }
  }
  return e != (ON_SubDEdge *)0x0;
}

Assistant:

bool ON_SubDHeap::ReturnEdgeExtraArray(
  ON_SubDEdge* e
  )
{
  if ( nullptr == e )
    return ON_SUBD_RETURN_ERROR(false);
  if (nullptr != e->m_facex || e->m_facex_capacity > 0)
  {
    ReturnArray(e->m_facex_capacity,(ON__UINT_PTR*)e->m_facex);
    e->m_facex = nullptr;
    e->m_facex_capacity = 0;
  }
  if (e->m_face_count > 2)
    e->m_face_count = 2;
  return true;
}